

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O3

void __thiscall
soplex::SoPlexBase<double>::addRowReal(SoPlexBase<double> *this,LPRowBase<double> *lprow)

{
  undefined1 *puVar1;
  SPxLPRational *pSVar2;
  LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  LStack_108;
  
  _addRowReal(this,lprow);
  if (this->_currentSettings->_intParamValues[0xf] == 1) {
    pSVar2 = this->_rationalLP;
    LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::LPRowBase<double>(&LStack_108,lprow);
    (*(pSVar2->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
      ._vptr_ClassArray[5])(pSVar2,&LStack_108,0);
    LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::~LPRowBase(&LStack_108);
    _completeRangeTypesRational(this);
  }
  this->_status = UNKNOWN;
  puVar1 = &(this->_solReal).field_0x98;
  *puVar1 = *puVar1 & 0xf0;
  this->_hasSolReal = false;
  this->_hasSolRational = false;
  puVar1 = &(this->_solRational).field_0xd0;
  *puVar1 = *puVar1 & 0xf0;
  return;
}

Assistant:

void SoPlexBase<R>::addRowReal(const LPRowBase<R>& lprow)
{
   assert(_realLP != nullptr);

   _addRowReal(lprow);

   if(intParam(SoPlexBase<R>::SYNCMODE) == SYNCMODE_AUTO)
   {
      _rationalLP->addRow(lprow);
      _completeRangeTypesRational();
   }

   _invalidateSolution();
}